

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

bool __thiscall
cmELFInternalImpl<cmELFTypes32>::LoadDynamicSection(cmELFInternalImpl<cmELFTypes32> *this)

{
  bool bVar1;
  pointer pbVar2;
  reference x;
  ELF_Dyn *dyn;
  __mbstate_t local_30;
  int local_28;
  uint local_24;
  int j;
  int n;
  ELF_Shdr *sec;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  
  if ((this->super_cmELFInternal).DynamicSectionIndex < 0) {
    this_local._7_1_ = false;
  }
  else {
    sec = (ELF_Shdr *)this;
    bVar1 = std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::empty(&this->DynamicSectionEntries);
    if (bVar1) {
      _j = std::vector<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>::operator[]
                     (&this->SectionHeaders,(long)(this->super_cmELFInternal).DynamicSectionIndex);
      if (_j->sh_entsize == 0) {
        this_local._7_1_ = false;
      }
      else {
        local_24 = _j->sh_size / _j->sh_entsize;
        std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::resize
                  (&this->DynamicSectionEntries,(long)(int)local_24);
        for (local_28 = 0; local_28 < (int)local_24; local_28 = local_28 + 1) {
          pbVar2 = std::
                   unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                   ::operator->(&(this->super_cmELFInternal).Stream);
          std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)&dyn,(ulong)(_j->sh_offset + _j->sh_entsize * local_28));
          std::istream::seekg(pbVar2,dyn,local_30);
          x = std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::operator[]
                        (&this->DynamicSectionEntries,(long)local_28);
          bVar1 = Read(this,x);
          if (!bVar1) {
            cmELFInternal::SetErrorMessage
                      (&this->super_cmELFInternal,"Error reading entry from DYNAMIC section.");
            (this->super_cmELFInternal).DynamicSectionIndex = -1;
            return false;
          }
        }
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmELFInternalImpl<Types>::LoadDynamicSection()
{
  // If there is no dynamic section we are done.
  if (this->DynamicSectionIndex < 0) {
    return false;
  }

  // If the section was already loaded we are done.
  if (!this->DynamicSectionEntries.empty()) {
    return true;
  }

  // If there are no entries we are done.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if (sec.sh_entsize == 0) {
    return false;
  }

  // Allocate the dynamic section entries.
  int n = static_cast<int>(sec.sh_size / sec.sh_entsize);
  this->DynamicSectionEntries.resize(n);

  // Read each entry.
  for (int j = 0; j < n; ++j) {
    // Seek to the beginning of the section entry.
    this->Stream->seekg(sec.sh_offset + sec.sh_entsize * j);
    ELF_Dyn& dyn = this->DynamicSectionEntries[j];

    // Try reading the entry.
    if (!this->Read(dyn)) {
      this->SetErrorMessage("Error reading entry from DYNAMIC section.");
      this->DynamicSectionIndex = -1;
      return false;
    }
  }
  return true;
}